

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::LoadVariableOperator> *op)

{
  UserDefinedVariableName name;
  string_view name_00;
  element_type *this_00;
  string *this_01;
  Visitor<__int128> *in_RDI;
  ostream *ostream;
  _Optional_payload_base<int> in_stack_ffffffffffffffc0;
  optional<int> local_38;
  Visitor<__int128> *in_stack_ffffffffffffffd0;
  UserDefinedVariableName local_20 [2];
  
  AppendVariableDeclarationBegin(in_stack_ffffffffffffffd0);
  ostream = in_RDI->os;
  this_00 = std::
            __shared_ptr_access<const_calc4::LoadVariableOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_calc4::LoadVariableOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x138055);
  this_01 = LoadVariableOperator::GetVariableName_abi_cxx11_(this_00);
  name_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01)
  ;
  UserDefinedVariableName::UserDefinedVariableName(local_20,name_00);
  name.name._M_str = (char *)in_stack_ffffffffffffffc0;
  name.name._M_len = (size_t)in_RDI;
  anon_unknown_0::operator<<(ostream,name);
  AppendVariableDeclarationEnd((Visitor<__int128> *)0x1380a1);
  std::optional<int>::optional(&local_38);
  Return(in_RDI,(optional<int>)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const LoadVariableOperator>& op) override
    {
        AppendVariableDeclarationBegin();
        os << UserDefinedVariableName(op->GetVariableName());
        AppendVariableDeclarationEnd();
        Return();
    }